

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O2

size_t ZSTD_initDDict_internal
                 (ZSTD_DDict *ddict,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  int *dict_00;
  void *__dest;
  size_t sVar1;
  
  if (((dict == (void *)0x0) || (dictSize == 0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    ddict->dictBuffer = (void *)0x0;
    ddict->dictContent = dict;
    if (dict == (void *)0x0) {
      dictSize = 0;
    }
  }
  else {
    __dest = ZSTD_malloc(dictSize,ddict->cMem);
    ddict->dictBuffer = __dest;
    ddict->dictContent = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,dict,dictSize);
  }
  ddict->dictSize = dictSize;
  (ddict->entropy).hufTable[0] = 0xc00000c;
  ddict->dictID = 0;
  ddict->entropyPresent = 0;
  if (dictContentType != ZSTD_dct_rawContent) {
    if (dictSize < 8) {
      if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe2;
      }
    }
    else {
      dict_00 = (int *)ddict->dictContent;
      if (*dict_00 == -0x13cf5bc9) {
        ddict->dictID = dict_00[1];
        sVar1 = ZSTD_loadDEntropy(&ddict->entropy,dict_00,dictSize);
        if (0xffffffffffffff88 < sVar1) {
          return 0xffffffffffffffe2;
        }
        ddict->entropyPresent = 1;
      }
      else if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe2;
      }
    }
  }
  return 0;
}

Assistant:

static size_t ZSTD_initDDict_internal(ZSTD_DDict* ddict,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType)
{
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dict) || (!dictSize)) {
        ddict->dictBuffer = NULL;
        ddict->dictContent = dict;
        if (!dict) dictSize = 0;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, ddict->cMem);
        ddict->dictBuffer = internalBuffer;
        ddict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dict, dictSize);
    }
    ddict->dictSize = dictSize;
    ddict->entropy.hufTable[0] = (HUF_DTable)((HufLog)*0x1000001);  /* cover both little and big endian */

    /* parse dictionary content */
    CHECK_F( ZSTD_loadEntropy_intoDDict(ddict, dictContentType) );

    return 0;
}